

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

lua_CFunction lua_tocfunction(lua_State *L,int idx)

{
  TValue *pTVar1;
  ulong uVar2;
  lua_CFunction p_Var3;
  
  pTVar1 = index2adr(L,idx);
  if (((pTVar1->field_4).it >> 0xf == 0x1fff7) &&
     (uVar2 = (ulong)pTVar1->field_4 & 0x7fffffffffff, 0xfffffffd < **(byte **)(uVar2 + 0x20) - 0x61
     )) {
    p_Var3 = *(lua_CFunction *)(uVar2 + 0x28);
  }
  else {
    p_Var3 = (lua_CFunction)0x0;
  }
  return p_Var3;
}

Assistant:

LUA_API lua_CFunction lua_tocfunction(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  if (tvisfunc(o)) {
    BCOp op = bc_op(*mref(funcV(o)->c.pc, BCIns));
    if (op == BC_FUNCC || op == BC_FUNCCW)
      return funcV(o)->c.f;
  }
  return NULL;
}